

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_std_file_read_write(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  FILE *__stream;
  uint8_t *puVar2;
  JSValueUnion JVar3;
  ulong uVar4;
  bool bVar5;
  JSValue JVar6;
  JSValue JVar7;
  size_t size;
  uint64_t len;
  uint64_t pos;
  ulong local_40;
  size_t local_38;
  uint64_t local_30;
  
  __stream = (FILE *)js_std_file_get(ctx,this_val);
  if (__stream != (FILE *)0x0) {
    iVar1 = JS_ToIndex(ctx,&local_30,argv[1]);
    if (iVar1 == 0) {
      iVar1 = JS_ToIndex(ctx,&local_38,argv[2]);
      if (iVar1 == 0) {
        puVar2 = JS_GetArrayBuffer(ctx,&local_40,*argv);
        if (puVar2 != (uint8_t *)0x0) {
          if (local_40 < local_38 + local_30) {
            JVar7 = JS_ThrowRangeError(ctx,"read/write array buffer overflow");
          }
          else {
            if (magic == 0) {
              uVar4 = fread(puVar2 + local_30,1,local_38,__stream);
            }
            else {
              uVar4 = fwrite(puVar2 + local_30,1,local_38,__stream);
            }
            bVar5 = (long)(int)uVar4 == uVar4;
            JVar3.float64 = (double)(long)uVar4;
            if (bVar5) {
              JVar3.ptr = (void *)(uVar4 & 0xffffffff);
            }
            JVar7.tag = 7;
            JVar7.u.float64 = JVar3.float64;
            if (bVar5) {
              JVar7.tag = 0;
            }
          }
          uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
          goto LAB_0010fa6d;
        }
      }
    }
  }
  JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  uVar4 = 0;
LAB_0010fa6d:
  JVar6.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar4);
  JVar6.tag = JVar7.tag;
  return JVar6;
}

Assistant:

static JSValue js_std_file_read_write(JSContext *ctx, JSValueConst this_val,
                                      int argc, JSValueConst *argv, int magic)
{
    FILE *f = js_std_file_get(ctx, this_val);
    uint64_t pos, len;
    size_t size, ret;
    uint8_t *buf;
    
    if (!f)
        return JS_EXCEPTION;
    if (JS_ToIndex(ctx, &pos, argv[1]))
        return JS_EXCEPTION;
    if (JS_ToIndex(ctx, &len, argv[2]))
        return JS_EXCEPTION;
    buf = JS_GetArrayBuffer(ctx, &size, argv[0]);
    if (!buf)
        return JS_EXCEPTION;
    if (pos + len > size)
        return JS_ThrowRangeError(ctx, "read/write array buffer overflow");
    if (magic)
        ret = fwrite(buf + pos, 1, len, f);
    else
        ret = fread(buf + pos, 1, len, f);
    return JS_NewInt64(ctx, ret);
}